

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

errr finish_parse_history(parser *p)

{
  history_entry *phVar1;
  history_chart *hs;
  history_chart *phVar2;
  history_entry *phVar3;
  history_chart *phVar4;
  history_entry *phVar5;
  
  phVar2 = (history_chart *)parser_priv(p);
  histories = phVar2;
  do {
    if (phVar2 == (history_chart *)0x0) {
      parser_destroy(p);
      return 0;
    }
    phVar1 = phVar2->entries;
    phVar5 = (history_entry *)0x0;
    while (phVar3 = phVar1, phVar3 != (history_entry *)0x0) {
      phVar1 = phVar3->next;
      phVar3->next = phVar5;
      phVar5 = phVar3;
    }
    phVar2->entries = phVar5;
    hs = histories;
    for (; phVar5 != (history_entry *)0x0; phVar5 = phVar5->next) {
      if (phVar5->isucc != L'\0') {
        phVar4 = findchart(hs,phVar5->isucc);
        phVar5->succ = phVar4;
        if (phVar4 == (history_chart *)0x0) {
          return -1;
        }
      }
    }
    phVar2 = phVar2->next;
  } while( true );
}

Assistant:

static errr finish_parse_history(struct parser *p) {
	struct history_chart *c;
	struct history_entry *e, *prev, *next;
	histories = parser_priv(p);

	/* Go fix up the entry successor pointers. We can't compute them at
	 * load-time since we may not have seen the successor history yet. Also,
	 * we need to put the entries in the right order; the parser actually
	 * stores them backwards, which is not desirable.
	 */
	for (c = histories; c; c = c->next) {
		e = c->entries;
		prev = NULL;
		while (e) {
			next = e->next;
			e->next = prev;
			prev = e;
			e = next;
		}
		c->entries = prev;
		for (e = c->entries; e; e = e->next) {
			if (!e->isucc)
				continue;
			e->succ = findchart(histories, e->isucc);
			if (!e->succ) {
				return -1;
			}
		}
	}

	parser_destroy(p);
	return 0;
}